

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demoend_playground.cpp
# Opt level: O3

int main(void)

{
  _Manager_type p_Var1;
  ostream *poVar2;
  state_conditions *this;
  long lVar3;
  inputs_type inputs;
  SM sm;
  inputs_type local_17c;
  state_machine<cdplayer> local_178;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- CD player demo playground ---\n",0x22);
  estl::state_machine<cdplayer>::state_machine(&local_178);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"states_count() : ",0x11)
  ;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"current state  : ",0x11)
  ;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_178.state_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tv1.size()      : ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  estl::state_machine<cdplayer>::test_transitions(&local_178,&tv1,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sm.test_transitions(tv1):",0x19);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  local_17c.event = no_btn_presed;
  local_178.state_ = on;
  estl::state_machine<cdplayer>::execute_actions(&local_178,on,&local_17c,&local_178.outputs_);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::
  vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
  ::~vector(&local_178.actions_);
  lVar3 = -0x140;
  this = &local_178.state_switches_._M_elems[3].switch_conditions_m;
  do {
    std::
    vector<estl::state_machine<cdplayer>::condition,_std::allocator<estl::state_machine<cdplayer>::condition>_>
    ::~vector(&this->conditions_m);
    p_Var1 = (((switch_entry *)(this + -1))->user_do_switch_function_m).super__Function_base.
             _M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&((switch_entry *)(this + -1))->user_do_switch_function_m,
                (_Any_data *)&((switch_entry *)(this + -1))->user_do_switch_function_m,
                __destroy_functor);
    }
    this = this + -2;
    lVar3 = lVar3 + 0x50;
  } while (lVar3 != 0);
  return 0;
}

Assistant:

int main()
{
    cout << "--- CD player demo playground ---\n";
    SM sm;
    cout << "states_count() : " << sm.states_count() << "\n";
    cout << "current state  : " << sm.state_int() << "\n";
    cout << "tv1.size()      : " << tv1.size() << "\n";
    const auto all_ok = sm.test_transitions(tv1, true);
    cout << "sm.test_transitions(tv1):" << all_ok << "\n";


    SM::inputs_type inputs;
    sm.state_set(state_type::on);
    sm.execute_actions(inputs);


//    cout << sm.outputs().debug_str() << endl;

    cout << endl;
    return 0;
}